

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeIntegerAffinity(Mem *pMem)

{
  i64 iVar1;
  i64 ix;
  Mem *pMem_local;
  
  iVar1 = doubleToInt64((pMem->u).r);
  if (((((pMem->u).r == (double)iVar1) && (!NAN((pMem->u).r) && !NAN((double)iVar1))) &&
      (-0x8000000000000000 < iVar1)) && (iVar1 < 0x7fffffffffffffff)) {
    (pMem->u).i = iVar1;
    pMem->flags = pMem->flags & 0xf240 | 4;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeIntegerAffinity(Mem *pMem){
  i64 ix;
  assert( pMem!=0 );
  assert( pMem->flags & MEM_Real );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );

  ix = doubleToInt64(pMem->u.r);

  /* Only mark the value as an integer if
  **
  **    (1) the round-trip conversion real->int->real is a no-op, and
  **    (2) The integer is neither the largest nor the smallest
  **        possible integer (ticket #3922)
  **
  ** The second and third terms in the following conditional enforces
  ** the second condition under the assumption that addition overflow causes
  ** values to wrap around.
  */
  if( pMem->u.r==ix && ix>SMALLEST_INT64 && ix<LARGEST_INT64 ){
    pMem->u.i = ix;
    MemSetTypeFlag(pMem, MEM_Int);
  }
}